

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  lua_State *plVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  lua_State *plVar7;
  
  pcVar4 = *argv;
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    progname = pcVar4;
  }
  plVar3 = (lua_State *)0x0;
  iVar5 = 1;
  iVar2 = listing;
LAB_001043ef:
  plVar7 = plVar3;
  if (argc <= iVar5) goto LAB_001044dd;
  pcVar4 = argv[iVar5];
  if (*pcVar4 != '-') goto LAB_001044dd;
  cVar1 = pcVar4[1];
  iVar6 = (int)plVar3;
  switch(cVar1) {
  case 'l':
    if (pcVar4[2] != '\0') break;
    iVar2 = iVar2 + 1;
    listing = iVar2;
LAB_001044af:
    iVar5 = iVar5 + 1;
    goto LAB_001043ef;
  case 'm':
  case 'n':
  case 'q':
  case 'r':
  case 't':
  case 'u':
    break;
  case 'o':
    if (pcVar4[2] != '\0') break;
    output = argv[(long)iVar5 + 1];
    if (output != (char *)0x0) {
      iVar5 = iVar5 + 1;
      if (*output == '-') {
        if (output[1] != '\0') goto LAB_00104597;
        output = (char *)0x0;
      }
      else if (*output == '\0') goto LAB_00104597;
      goto LAB_001044af;
    }
    goto LAB_00104597;
  case 'p':
    if (pcVar4[2] == '\0') {
      dumping = 1;
      goto LAB_001044af;
    }
    break;
  case 's':
    if (pcVar4[2] == '\0') {
      stripping = 1;
      goto LAB_001044af;
    }
    break;
  case 'v':
    if (pcVar4[2] == '\0') {
      plVar3 = (lua_State *)(ulong)(iVar6 + 1);
      goto LAB_001044af;
    }
    break;
  default:
    if (cVar1 == '\0') goto LAB_001044dd;
    if ((cVar1 == '-') && (pcVar4[2] == '\0')) {
      iVar5 = iVar5 + 1;
      plVar7 = (lua_State *)(ulong)(iVar6 + 1);
      if (iVar6 == 0) {
        plVar7 = plVar3;
      }
      goto LAB_001044dd;
    }
  }
  usage(pcVar4);
LAB_00104597:
  usage("\'-o\' needs argument");
  goto LAB_001045a3;
LAB_001044dd:
  if ((iVar5 == argc) && ((iVar2 != 0 || (iVar5 = argc, (dumping & 1) != 0)))) {
    dumping = 1;
    iVar5 = argc + -1;
    argv[(long)argc + -1] = Output;
  }
  if (((int)plVar7 != 0) &&
     (puts("Lua 5.3.4  Copyright (C) 1994-2017 Lua.org, PUC-Rio"), (int)plVar7 == argc + -1))
  goto LAB_001045d0;
  plVar3 = plVar7;
  if (argc - iVar5 == 0 || argc < iVar5) {
LAB_001045a3:
    usage("no input files given");
    plVar7 = plVar3;
LAB_001045af:
    plVar3 = plVar7;
    fatal("cannot create state: not enough memory");
  }
  else {
    plVar3 = luaL_newstate();
    if (plVar3 == (lua_State *)0x0) goto LAB_001045af;
    lua_pushcclosure(plVar3,pmain,0);
    lua_pushinteger(plVar3,(ulong)(uint)(argc - iVar5));
    lua_pushlightuserdata(plVar3,argv + iVar5);
    iVar5 = lua_pcallk(plVar3,2,0,0,0,(lua_KFunction)0x0);
    if (iVar5 == 0) {
      lua_close(plVar3);
      return 0;
    }
  }
  pcVar4 = lua_tolstring(plVar3,-1,(size_t *)0x0);
  fatal(pcVar4);
LAB_001045d0:
  exit(0);
}

Assistant:

int main(int argc, char *argv[]) {
    lua_State *L;
    int i = doargs(argc, argv);
    argc -= i;
    argv += i;
    if (argc <= 0) usage("no input files given");
    L = luaL_newstate();
    if (L == NULL) fatal("cannot create state: not enough memory");
    lua_pushcfunction(L, &pmain);
    lua_pushinteger(L, argc);
    lua_pushlightuserdata(L, argv);
    if (lua_pcall(L, 2, 0, 0) != LUA_OK) fatal(lua_tostring(L, -1));
    lua_close(L);
    return EXIT_SUCCESS;
}